

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t __thiscall
duckdb::SimpleReadTransport::read_virt(SimpleReadTransport *this,uint8_t *buf,uint32_t len)

{
  uint uVar1;
  
  uVar1 = this->read_buffer_size - this->read_buffer_offset;
  if (len <= uVar1) {
    switchD_016b0717::default(buf,this->read_buffer + this->read_buffer_offset,(ulong)len);
    this->read_buffer_offset = this->read_buffer_offset + len;
    uVar1 = len;
  }
  return uVar1;
}

Assistant:

uint32_t read_virt(uint8_t *buf, uint32_t len) override {
		const auto remaining = read_buffer_size - read_buffer_offset;
		if (len > remaining) {
			return remaining;
		}
		memcpy(buf, read_buffer + read_buffer_offset, len);
		read_buffer_offset += len;
		return len;
	}